

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall gtest_suite_UnsignedToString_::One<unsigned_int>::TestBody(One<unsigned_int> *this)

{
  bool bVar1;
  char *message;
  pair<const_char_*,_const_char_*> pVar2;
  AssertHelper local_90;
  Message local_88 [3];
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  char *local_30;
  pair<const_char_*,_const_char_*> x;
  TypeParam_conflict one;
  base10storage<TypeParam>_conflict out;
  One<unsigned_int> *this_local;
  
  x.second._0_4_ = 1;
  pstore::gsl::not_null<std::array<char,_10UL>_*>::not_null
            ((not_null<std::array<char,_10UL>_*> *)&gtest_ar.message_,
             (array<char,_10UL> *)((long)&x.second + 6));
  pVar2 = pstore::exchange::export_ns::details::to_characters<unsigned_int,_void>
                    (1,(not_null<std::array<char,_10UL>_*>)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
  local_30 = pVar2.first;
  x.first = pVar2.second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)&local_68,local_30,x.first,&local_69);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_48,"(std::string{x.first, x.second})","\"1\"",&local_68,
             (char (*) [2])0x3023aa);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  return;
}

Assistant:

TYPED_TEST_P (UnsignedToString, One) {
    using namespace pstore::exchange::export_ns::details;
    base10storage<TypeParam> out;
    auto const one = TypeParam{1};
    std::pair<char const *, char const *> const x = to_characters (one, &out);
    EXPECT_EQ ((std::string{x.first, x.second}), "1");
}